

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# teglSwapBuffersWithDamageTests.cpp
# Opt level: O2

void __thiscall
deqp::egl::anon_unknown_0::SwapBuffersWithDamageTest::checkExtension
          (SwapBuffersWithDamageTest *this,Library *egl,EGLDisplay eglDisplay)

{
  bool bVar1;
  NotSupportedError *this_00;
  allocator<char> local_31;
  string local_30;
  
  std::__cxx11::string::string<std::allocator<char>>
            ((string *)&local_30,"EGL_KHR_swap_buffers_with_damage",&local_31);
  bVar1 = eglu::hasExtension(egl,eglDisplay,&local_30);
  std::__cxx11::string::~string((string *)&local_30);
  if (bVar1) {
    return;
  }
  this_00 = (NotSupportedError *)__cxa_allocate_exception(0x38);
  tcu::NotSupportedError::NotSupportedError
            (this_00,"EGL_KHR_swap_buffers_with_damage is not supported",(char *)0x0,
             "/workspace/llm4binary/github/license_all_cmakelists_25/kaydenl[P]VK-GL-CTS/modules/egl/teglSwapBuffersWithDamageTests.cpp"
             ,0x140);
  __cxa_throw(this_00,&tcu::NotSupportedError::typeinfo,tcu::Exception::~Exception);
}

Assistant:

void SwapBuffersWithDamageTest::checkExtension (const Library& egl, EGLDisplay eglDisplay)
{
	if (!eglu::hasExtension(egl, eglDisplay, "EGL_KHR_swap_buffers_with_damage"))
		TCU_THROW(NotSupportedError, "EGL_KHR_swap_buffers_with_damage is not supported");
}